

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::GetTextureSubImage::Functional::iterate(Functional *this)

{
  GLuint *pGVar1;
  ostringstream *this_00;
  GLenum GVar2;
  RenderContext *pRVar3;
  bool bVar4;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  long lVar8;
  byte bVar9;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_get_texture_sub_image");
  pRVar3 = this->m_context->m_renderCtx;
  iVar6 = (*pRVar3->_vptr_RenderContext[7])(pRVar3,"glGetCompressedTextureSubImage");
  this->m_gl_GetCompressedTextureSubImage =
       (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)CONCAT44(extraout_var,iVar6);
  iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[7])();
  this->m_gl_GetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar6);
  if (((PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar6) ==
       (PFNGLGETTEXTURESUBIMAGEPROC)0x0) ||
     (this->m_gl_GetCompressedTextureSubImage == (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)0x0)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
               ,0x56);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  if (bVar4 || bVar5) {
    pGVar1 = &this->m_texture;
    bVar9 = 1;
    lVar8 = 0;
    do {
      GVar2 = *(GLenum *)((long)&DAT_01a12760 + lVar8);
      prepare(this,GVar2,false);
      bVar4 = check(this,GVar2,false);
      iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
      if (*pGVar1 != 0) {
        (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x480))(1,pGVar1);
        *pGVar1 = 0;
      }
      bVar9 = bVar9 & bVar4;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x20);
    lVar8 = 0;
    do {
      GVar2 = *(GLenum *)((long)&DAT_01a12780 + lVar8);
      prepare(this,GVar2,true);
      bVar4 = check(this,GVar2,true);
      iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
      if (*pGVar1 != 0) {
        (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x480))(1);
        *pGVar1 = 0;
      }
      bVar9 = bVar9 & bVar4;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x10);
    if (bVar9 == 0) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_008add01;
    }
  }
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_008add01:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::GetTextureSubImage::Functional::iterate(void)
{
	bool is_ok		= true;
	bool test_error = false;

	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_get_texture_sub_image = m_context.getContextInfo().isExtensionSupported("GL_ARB_get_texture_sub_image");

	/* Bind function pointers. */
	m_gl_GetCompressedTextureSubImage =
		(PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress(
			"glGetCompressedTextureSubImage");
	m_gl_GetTextureSubImage =
		(PFNGLGETTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress("glGetTextureSubImage");

	try
	{
		/* Report error when function pointers are not available. */
		if ((DE_NULL == m_gl_GetCompressedTextureSubImage) || (DE_NULL == m_gl_GetTextureSubImage))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
				<< tcu::TestLog::EndMessage;
			throw 0;
		}

		/* Run tests. */
		if (is_at_least_gl_45 || is_arb_get_texture_sub_image)
		{
			/* Tested targets. */
			glw::GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D,
									  GL_TEXTURE_RECTANGLE, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
									  GL_TEXTURE_2D_ARRAY,  GL_TEXTURE_3D };

			glw::GLuint targets_count = sizeof(targets) / sizeof(targets[0]);

			for (glw::GLuint i = 0; i < targets_count; ++i)
			{
				prepare(targets[i], false);

				is_ok &= check(targets[i], false);

				clean();
			}

			/* Compressed textures tested targets. */
			glw::GLenum compressed_targets[] = { GL_TEXTURE_2D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
												 GL_TEXTURE_2D_ARRAY };

			glw::GLuint compressed_targets_count = sizeof(compressed_targets) / sizeof(compressed_targets[0]);

			for (glw::GLuint i = 0; i < compressed_targets_count; ++i)
			{
				prepare(compressed_targets[i], true);

				is_ok &= check(compressed_targets[i], true);

				clean();
			}
		}
	}
	catch (...)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test error has occured." << tcu::TestLog::EndMessage;

		is_ok	  = false;
		test_error = true;

		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}